

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_def_io.c
# Opt level: O0

char * comma_whacker(char *s)

{
  char *pcVar1;
  char *ret;
  char *s_local;
  
  if (s != (char *)0x0) {
    comma_whacker::p = s;
  }
  pcVar1 = comma_whacker::p;
  if (comma_whacker::p != (char *)0x0) {
    comma_whacker::nxt = strchr(comma_whacker::p,0x2c);
    if (comma_whacker::nxt != (char *)0x0) {
      *comma_whacker::nxt = '\0';
    }
    comma_whacker::p = comma_whacker::nxt;
  }
  return pcVar1;
}

Assistant:

char *comma_whacker(char *s)
{
    static char *p;
    static char *nxt;
    char *ret;

    if (s != NULL)
	p = s;

    ret = p;
    
    if (ret != NULL) {
	nxt = strchr(p, ',');

	if (nxt) {
	    *nxt = '\0';
	}

	p = nxt;
    }

    return ret;
}